

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

iterator __thiscall QList<Header>::end(QList<Header> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<Header>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<Header> *)0x0);
  }
  return (iterator)((this->d).ptr + (this->d).size);
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }